

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

void __thiscall
BMRS_XZ<UF>::FindRuns
          (BMRS_XZ<UF> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ulong *puVar2;
  ushort uVar3;
  Run *pRVar4;
  uint *puVar5;
  uint uVar6;
  long lVar7;
  short sVar8;
  ushort uVar9;
  Run *pRVar10;
  Run *pRVar11;
  ulong *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ushort uVar16;
  long lVar17;
  short sVar18;
  unsigned_short uVar19;
  uint64_t *puVar20;
  uint uVar21;
  ulong uVar22;
  uint64_t uVar23;
  Run *pRVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  
  puVar5 = UF::P_;
  lVar7 = (long)data_width;
  uVar23 = *bits_start;
  sVar18 = 0;
  pRVar11 = runs;
  puVar20 = bits_start;
  do {
    lVar26 = 0;
    if (uVar23 != 0) {
      for (; (uVar23 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
      }
    }
    sVar8 = (short)lVar26;
    if (uVar23 == 0) {
      do {
        puVar20 = puVar20 + 1;
        if (puVar20 == bits_start + lVar7) {
          pRVar11->start_pos = 0xffff;
          pRVar11->end_pos = 0xffff;
          if (height < 2) {
LAB_00239531:
            puVar5 = UF::P_;
            uVar6 = 1;
            if (1 < UF::length_) {
              uVar6 = 1;
              uVar22 = 1;
              do {
                if (puVar5[uVar22] < uVar22) {
                  puVar5[uVar22] = puVar5[puVar5[uVar22]];
                }
                else {
                  puVar5[uVar22] = uVar6;
                  uVar6 = uVar6 + 1;
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 < UF::length_);
            }
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
            return;
          }
          uVar22 = 1;
LAB_00239191:
          pRVar10 = pRVar11 + 1;
          puVar20 = bits_flag + (uVar22 - 1) * lVar7;
          puVar12 = bits_start + uVar22 * lVar7;
          puVar2 = puVar12 + lVar7;
          uVar28 = *puVar12;
          lVar26 = 0;
          pRVar11 = pRVar10;
          do {
            lVar17 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            lVar25 = lVar26;
            if (uVar28 == 0) {
              do {
                puVar12 = puVar12 + 1;
                if (puVar12 == puVar2) {
                  pRVar11->start_pos = 0xffff;
                  pRVar11->end_pos = 0xffff;
                  uVar22 = uVar22 + 1;
                  runs = pRVar10;
                  if (uVar22 != (uint)height) goto LAB_00239191;
                  goto LAB_00239531;
                }
                lVar25 = lVar26 + 0x40;
                uVar28 = *puVar12;
                lVar17 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                lVar26 = lVar25;
              } while (uVar28 == 0);
            }
            uVar28 = (~uVar28 >> ((byte)lVar17 & 0x3f)) << ((byte)lVar17 & 0x3f);
            lVar27 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            lVar26 = lVar25;
            if (uVar28 == 0) {
              do {
                lVar26 = lVar26 + 0x40;
                puVar1 = puVar12 + 1;
                puVar12 = puVar12 + 1;
                uVar28 = ~*puVar1;
                lVar27 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
              } while (*puVar1 == 0xffffffffffffffff);
            }
            uVar16 = (ushort)(lVar17 + lVar25);
            uVar6 = (uint)(lVar17 + lVar25) & 0xffff;
            pRVar24 = runs;
            do {
              runs = pRVar24;
              uVar3 = runs->end_pos;
              pRVar24 = runs + 1;
            } while (uVar3 < uVar6);
            uVar9 = runs->start_pos;
            uVar19 = (unsigned_short)(lVar27 + lVar26);
            uVar21 = (uint)(lVar27 + lVar26) & 0xffff;
            if (uVar21 < uVar9) {
              pRVar11->start_pos = uVar16;
              pRVar11->end_pos = uVar19;
              UF::P_[UF::length_] = UF::length_;
              uVar6 = UF::length_ + 1;
              pRVar11->label = UF::length_;
              UF::length_ = uVar6;
            }
            else {
              if (uVar9 <= uVar6) {
                uVar9 = uVar16;
              }
              if (uVar3 < uVar21) {
                uVar23 = is_connected(this,puVar20,(uint)uVar9,(uint)uVar3);
                if (uVar23 == 0) {
                  uVar6 = 0;
                }
                else {
                  uVar6 = UF::P_[runs->label];
                }
                uVar3 = pRVar24->start_pos;
                pRVar4 = runs;
                while (runs = pRVar24, uVar15 = uVar6, uVar3 <= uVar21) {
                  if (uVar21 <= pRVar4[1].end_pos) {
                    uVar23 = is_connected(this,puVar20,(uint)uVar3,uVar21);
                    if (((uVar23 != 0) && (uVar21 = UF::P_[pRVar4[1].label], uVar6 != uVar21)) &&
                       (uVar15 = uVar21, uVar6 != 0)) {
                      do {
                        uVar14 = uVar6;
                        uVar6 = UF::P_[uVar14];
                      } while (UF::P_[uVar14] < uVar14);
                      do {
                        uVar15 = uVar21;
                        uVar21 = UF::P_[uVar15];
                      } while (UF::P_[uVar15] < uVar15);
                      uVar6 = uVar15;
                      if (uVar14 >= uVar15 && uVar14 != uVar15) {
                        uVar6 = uVar14;
                      }
                      if (uVar14 < uVar15) {
                        uVar15 = uVar14;
                      }
                      UF::P_[uVar6] = uVar15;
                    }
                    break;
                  }
                  uVar23 = is_connected(this,puVar20,(uint)uVar3,(uint)pRVar4[1].end_pos);
                  if (((uVar23 != 0) && (uVar14 = UF::P_[pRVar4[1].label], uVar6 != uVar14)) &&
                     (uVar15 = uVar14, uVar6 != 0)) {
                    do {
                      uVar13 = uVar6;
                      uVar6 = UF::P_[uVar13];
                    } while (UF::P_[uVar13] < uVar13);
                    do {
                      uVar15 = uVar14;
                      uVar14 = UF::P_[uVar15];
                    } while (UF::P_[uVar15] < uVar15);
                    uVar6 = uVar15;
                    if (uVar13 >= uVar15 && uVar13 != uVar15) {
                      uVar6 = uVar13;
                    }
                    if (uVar13 < uVar15) {
                      uVar15 = uVar13;
                    }
                    UF::P_[uVar6] = uVar15;
                  }
                  pRVar24 = runs + 1;
                  pRVar4 = runs;
                  uVar6 = uVar15;
                  uVar3 = runs[1].start_pos;
                }
                if (uVar15 == 0) {
                  UF::P_[UF::length_] = UF::length_;
                  uVar15 = UF::length_;
                  UF::length_ = UF::length_ + 1;
                }
                pRVar11->label = uVar15;
                pRVar11->start_pos = uVar16;
                pRVar11->end_pos = uVar19;
              }
              else {
                uVar23 = is_connected(this,puVar20,(uint)uVar9,uVar21);
                if (uVar23 == 0) {
                  UF::P_[UF::length_] = UF::length_;
                  uVar6 = UF::length_;
                  UF::length_ = UF::length_ + 1;
                }
                else {
                  uVar6 = UF::P_[runs->label];
                }
                pRVar11->label = uVar6;
                pRVar11->start_pos = uVar16;
                pRVar11->end_pos = uVar19;
              }
            }
            uVar28 = ~uVar28 & -1L << ((byte)lVar27 & 0x3f);
            pRVar11 = pRVar11 + 1;
          } while( true );
        }
        sVar18 = sVar18 + 0x40;
        uVar23 = *puVar20;
        lVar26 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
          }
        }
        sVar8 = (short)lVar26;
      } while (uVar23 == 0);
    }
    uVar22 = (~uVar23 >> ((byte)sVar8 & 0x3f)) << ((byte)sVar8 & 0x3f);
    pRVar11->start_pos = sVar8 + sVar18;
    lVar26 = 0;
    if (uVar22 != 0) {
      for (; (uVar22 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
      }
    }
    sVar8 = (short)lVar26;
    if (uVar22 == 0) {
      do {
        sVar18 = sVar18 + 0x40;
        puVar12 = puVar20 + 1;
        puVar20 = puVar20 + 1;
        uVar22 = ~*puVar12;
        lVar26 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
          }
        }
        sVar8 = (short)lVar26;
      } while (*puVar12 == 0xffffffffffffffff);
    }
    uVar23 = (~uVar22 >> ((byte)sVar8 & 0x3f)) << ((byte)sVar8 & 0x3f);
    pRVar11->end_pos = sVar8 + sVar18;
    puVar5[UF::length_] = UF::length_;
    uVar6 = UF::length_ + 1;
    pRVar11->label = UF::length_;
    UF::length_ = uVar6;
    pRVar11 = pRVar11 + 1;
  } while( true );
}

Assistant:

void FindRuns(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
        out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::GetLabel(runs_up->label);
                    else runs->label = LabelsSolver::NewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::GetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::NewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }